

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBVertexStreamsTest::getShaderBody
          (XFBVertexStreamsTest *this,GLuint param_1,STAGES stage,string *out_assignments,
          string *out_calculations)

{
  char *local_30;
  GLchar *assignments;
  string *out_calculations_local;
  string *out_assignments_local;
  STAGES stage_local;
  GLuint param_3_local;
  XFBVertexStreamsTest *this_local;
  
  std::__cxx11::string::operator=((string *)out_calculations,"");
  local_30 = "";
  if (stage == GEOMETRY) {
    local_30 = getShaderBody::gs;
  }
  else if (stage == FRAGMENT) {
    local_30 = getShaderBody::fs;
  }
  std::__cxx11::string::operator=((string *)out_assignments,local_30);
  return;
}

Assistant:

void XFBVertexStreamsTest::getShaderBody(GLuint /* test_case_index */, Utils::Shader::STAGES stage,
										 std::string& out_assignments, std::string& out_calculations)
{
	out_calculations = "";

	// the shader declares the output variables with different "stream" qualifier, to make the data can export to
	// each stream, we must call the function EmitStreamVertex() and EndStreamPrimitive() to make each vertex emitted
	// by the GS is assigned to specific stream.
	static const GLchar* gs = "    goku   = uni_goku;\n"
							  "    gohan  = uni_gohan;\n"
							  "    goten  = uni_goten;\n"
							  "    EmitStreamVertex(0);\n"
							  "    EndStreamPrimitive(0);\n"
							  "    picolo = uni_picolo;\n"
							  "    vegeta = uni_vegeta;\n"
							  "    EmitStreamVertex(1);\n"
							  "    EndStreamPrimitive(1);\n"
							  "    bulma  = uni_bulma;\n"
							  "    EmitStreamVertex(2);\n"
							  "    EndStreamPrimitive(2);\n";

	static const GLchar* fs = "    fs_out = gohan + goku + goten + picolo + vegeta + bulma;\n";

	const GLchar* assignments = "";
	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		assignments = fs;
		break;
	case Utils::Shader::GEOMETRY:
		assignments = gs;
		break;
	default:
		break;
	}

	out_assignments = assignments;
}